

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

S2LatLngRect * S2LatLngRect::FromPoint(S2LatLngRect *__return_storage_ptr__,S2LatLng *p)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2LatLng *local_18;
  S2LatLng *p_local;
  
  local_18 = p;
  p_local = (S2LatLng *)__return_storage_ptr__;
  bVar1 = S2LatLng::is_valid(p);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x2e,kError,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Invalid S2LatLng in S2LatLngRect::GetDistance: ");
    poVar2 = ::operator<<(poVar2,local_18);
    S2LogMessageVoidify::operator&(&local_19,poVar2);
    S2LogMessage::~S2LogMessage(&local_30);
  }
  S2LatLngRect(__return_storage_ptr__,local_18,local_18);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2LatLngRect::FromPoint(const S2LatLng& p) {
  S2_DLOG_IF(ERROR, !p.is_valid())
      << "Invalid S2LatLng in S2LatLngRect::GetDistance: " << p;

  return S2LatLngRect(p, p);
}